

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_171beb8::IntProColTest::IntProColTest(IntProColTest *this)

{
  int width;
  ParamType *pPVar1;
  
  pPVar1 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  width = *(int *)&(pPVar1->
                   super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
                   ).
                   super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
                   .field_0x14;
  pPVar1 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  AverageTestBase<unsigned_char>::AverageTestBase
            (&this->super_AverageTestBase<unsigned_char>,width,
             (pPVar1->
             super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
             ).
             super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
             .super__Head_base<1UL,_int,_false>._M_head_impl,8);
  (this->super_AverageTestBase<unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__IntProColTest_00f44b88;
  (this->
  super_WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__IntProColTest_00f44bc8;
  this->vbuf_asm_ = (int16_t *)0x0;
  this->vbuf_c_ = (int16_t *)0x0;
  pPVar1 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  this->asm_func_ =
       (IntProColFunc)
       (pPVar1->
       super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       ).
       super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .
       super__Tuple_impl<2UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .super__Head_base<2UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_false>.
       _M_head_impl;
  pPVar1 = testing::
           WithParamInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           ::GetParam();
  this->c_func_ =
       (IntProColFunc)
       (pPVar1->
       super__Tuple_impl<0UL,_int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       ).
       super__Tuple_impl<1UL,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .
       super__Tuple_impl<2UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
       .super__Tuple_impl<3UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>.
       super__Head_base<3UL,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_false>.
       _M_head_impl;
  return;
}

Assistant:

IntProColTest()
      : AverageTestBase(GET_PARAM(0), GET_PARAM(1)), vbuf_asm_(nullptr),
        vbuf_c_(nullptr) {
    asm_func_ = GET_PARAM(2);
    c_func_ = GET_PARAM(3);
  }